

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderIntegerFunctionTests.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> *
vkt::shaderexecutor::anon_unknown_0::getScalarSizes
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,
          vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_> *symbols
          )

{
  pointer pSVar1;
  int iVar2;
  long lVar3;
  int ndx;
  long lVar4;
  allocator_type local_29;
  
  std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,
             ((long)(symbols->
                    super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(symbols->
                   super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                   )._M_impl.super__Vector_impl_data._M_start) / 0x38,&local_29);
  lVar3 = 0x20;
  for (lVar4 = 0;
      pSVar1 = (symbols->
               super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
               )._M_impl.super__Vector_impl_data._M_start,
      lVar4 < (int)(((long)(symbols->
                           super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1) / 0x38);
      lVar4 = lVar4 + 1) {
    iVar2 = glu::VarType::getScalarSize((VarType *)((long)&(pSVar1->name)._M_dataplus._M_p + lVar3))
    ;
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_start[lVar4] = iVar2;
    lVar3 = lVar3 + 0x38;
  }
  return __return_storage_ptr__;
}

Assistant:

static vector<int> getScalarSizes (const vector<Symbol>& symbols)
{
	vector<int> sizes(symbols.size());
	for (int ndx = 0; ndx < (int)symbols.size(); ++ndx)
		sizes[ndx] = symbols[ndx].varType.getScalarSize();
	return sizes;
}